

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 03-decompose.cpp
# Opt level: O0

void __thiscall anon_class_1_0_00000001::operator()(anon_class_1_0_00000001 *this)

{
  bool bVar1;
  failure *pfVar2;
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [39];
  allocator local_1c9;
  string local_1c8 [32];
  location local_1a8;
  expression_decomposer local_179;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_178;
  undefined1 local_170 [8];
  result failed_1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [32];
  location local_80;
  expression_decomposer local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  undefined1 local_38 [8];
  result failed;
  anon_class_1_0_00000001 *this_local;
  
  failed._32_8_ = this;
  do {
    local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               lest::expression_decomposer::operator<<
                         (&local_41,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          std_world_abi_cxx11_);
    lest::expression_lhs<std::__cxx11::string_const&>::operator>
              ((result *)local_38,(expression_lhs<std::__cxx11::string_const&> *)&local_40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std_hello_abi_cxx11_);
    bVar1 = lest::result::operator_cast_to_bool((result *)local_38);
    if (bVar1) {
      pfVar2 = (failure *)__cxa_allocate_exception(0x78);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]lest/example/03-decompose.cpp"
                 ,&local_a1);
      lest::location::location(&local_80,(text *)local_a0,0x52);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c8,"std_world > std_hello",&local_c9);
      std::__cxx11::string::string(local_f0,(string *)&failed);
      lest::failure::failure(pfVar2,&local_80,(string *)local_c8,(string *)local_f0);
      __cxa_throw(pfVar2,&lest::failure::typeinfo,lest::failure::~failure);
    }
    lest::result::~result((result *)local_38);
    bVar1 = lest::is_false();
  } while (bVar1);
  do {
    local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                lest::expression_decomposer::operator<<
                          (&local_179,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           std_world_abi_cxx11_);
    lest::expression_lhs<std::__cxx11::string_const&>::operator<
              ((result *)local_170,(expression_lhs<std::__cxx11::string_const&> *)&local_178,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std_hello_abi_cxx11_);
    bVar1 = lest::result::operator_cast_to_bool((result *)local_170);
    if (bVar1) {
      pfVar2 = (failure *)__cxa_allocate_exception(0x78);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]lest/example/03-decompose.cpp"
                 ,&local_1c9);
      lest::location::location(&local_1a8,(text *)local_1c8,0x53);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1f0,"std_world < std_hello",&local_1f1);
      std::__cxx11::string::string(local_218,(string *)&failed_1);
      lest::failure::failure(pfVar2,&local_1a8,(string *)local_1f0,(string *)local_218);
      __cxa_throw(pfVar2,&lest::failure::typeinfo,lest::failure::~failure);
    }
    lest::result::~result((result *)local_170);
    bVar1 = lest::is_false();
  } while (bVar1);
  return;
}

Assistant:

bool t() { return true; }